

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O0

int __thiscall lzham::lzcompressor::state::init(state *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  uint i_2;
  uint i_1;
  uint i;
  uint local_28;
  uint local_24;
  uint local_20;
  undefined1 local_1;
  
  (this->super_state_base).m_cur_ofs = 0;
  (this->super_state_base).m_cur_state = 0;
  for (local_20 = 0; local_20 < 2; local_20 = local_20 + 1) {
    uVar1 = raw_quasi_adaptive_huffman_data_model::init
                      (&this->m_rep_len_table[local_20].super_raw_quasi_adaptive_huffman_data_model,
                       (EVP_PKEY_CTX *)0x1);
    if ((uVar1 & 1) == 0) {
      local_1 = 0;
      this = (state *)(ulong)uVar1;
      goto LAB_00119626;
    }
    uVar1 = raw_quasi_adaptive_huffman_data_model::init
                      (&this->m_large_len_table[local_20].
                        super_raw_quasi_adaptive_huffman_data_model,(EVP_PKEY_CTX *)0x1);
    if ((uVar1 & 1) == 0) {
      local_1 = 0;
      this = (state *)(ulong)uVar1;
      goto LAB_00119626;
    }
  }
  uVar1 = raw_quasi_adaptive_huffman_data_model::init
                    (&(this->m_main_table).super_raw_quasi_adaptive_huffman_data_model,
                     (EVP_PKEY_CTX *)0x1);
  if ((uVar1 & 1) == 0) {
    local_1 = 0;
    this = (state *)(ulong)uVar1;
  }
  else {
    uVar1 = raw_quasi_adaptive_huffman_data_model::init
                      (&(this->m_dist_lsb_table).super_raw_quasi_adaptive_huffman_data_model,
                       (EVP_PKEY_CTX *)0x1);
    if ((uVar1 & 1) == 0) {
      local_1 = 0;
      this = (state *)(ulong)uVar1;
    }
    else {
      for (local_24 = 0; local_24 < 0x40; local_24 = local_24 + 1) {
        uVar1 = raw_quasi_adaptive_huffman_data_model::init
                          (&this->m_lit_table[local_24].super_raw_quasi_adaptive_huffman_data_model,
                           (EVP_PKEY_CTX *)0x1);
        if ((uVar1 & 1) == 0) {
          local_1 = 0;
          this = (state *)(ulong)uVar1;
          goto LAB_00119626;
        }
      }
      for (local_28 = 0; local_28 < 0x40; local_28 = local_28 + 1) {
        uVar1 = raw_quasi_adaptive_huffman_data_model::init
                          (&this->m_delta_lit_table[local_28].
                            super_raw_quasi_adaptive_huffman_data_model,(EVP_PKEY_CTX *)0x1);
        if ((uVar1 & 1) == 0) {
          local_1 = 0;
          this = (state *)(ulong)uVar1;
          goto LAB_00119626;
        }
      }
      (this->super_state_base).m_match_hist[0] = 1;
      (this->super_state_base).m_match_hist[1] = 1;
      (this->super_state_base).m_match_hist[2] = 1;
      (this->super_state_base).m_match_hist[3] = 1;
      (this->super_state_base).m_cur_ofs = 0;
      local_1 = 1;
    }
  }
LAB_00119626:
  return (int)CONCAT71((int7)((ulong)this >> 8),local_1);
}

Assistant:

bool lzcompressor::state::init(CLZBase& lzbase, bool fast_adaptive_huffman_updating, bool use_polar_codes)
   {
      m_cur_ofs = 0;
      m_cur_state = 0;

      for (uint i = 0; i < 2; i++)
      {
         if (!m_rep_len_table[i].init(true, CLZBase::cMaxMatchLen - CLZBase::cMinMatchLen + 1, fast_adaptive_huffman_updating, use_polar_codes)) return false;
         if (!m_large_len_table[i].init(true, CLZBase::cLZXNumSecondaryLengths, fast_adaptive_huffman_updating, use_polar_codes)) return false;
      }
      if (!m_main_table.init(true, CLZBase::cLZXNumSpecialLengths + (lzbase.m_num_lzx_slots - CLZBase::cLZXLowestUsableMatchSlot) * 8, fast_adaptive_huffman_updating, use_polar_codes)) return false;
      if (!m_dist_lsb_table.init(true, 16, fast_adaptive_huffman_updating, use_polar_codes)) return false;

      for (uint i = 0; i < (1 << CLZBase::cNumLitPredBits); i++)
      {
         if (!m_lit_table[i].init(true, 256, fast_adaptive_huffman_updating, use_polar_codes)) return false;
      }

      for (uint i = 0; i < (1 << CLZBase::cNumDeltaLitPredBits); i++)
      {
         if (!m_delta_lit_table[i].init(true, 256, fast_adaptive_huffman_updating, use_polar_codes)) return false;
      }

      m_match_hist[0] = 1;
      m_match_hist[1] = 1;
      m_match_hist[2] = 1;
      m_match_hist[3] = 1;

      m_cur_ofs = 0;

      return true;
   }